

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

void http_server_close(http_server_t *server)

{
  uint local_14;
  uint i;
  http_server_t *server_local;
  
  if (server != (http_server_t *)0x0) {
    if (server->clients != (http_client_t *)0x0) {
      for (local_14 = 0; local_14 < server->num_clients; local_14 = local_14 + 1) {
        if (server->clients[local_14].fd != -1) {
          close(server->clients[local_14].fd);
        }
      }
      free(server->clients);
    }
    server->clients = (http_client_t *)0x0;
    server->num_clients = 0;
    server->count_clients = 0;
    server->max_clients = 0;
    if (server->fd != -1) {
      close(server->fd);
    }
    server->fd = -1;
    server->callback = (http_client_callback_t *)0x0;
    return;
  }
  __assert_fail("server != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/http.c",0x48,
                "void http_server_close(http_server_t *)");
}

Assistant:

void http_server_close(http_server_t *server) {
  assert(server != NULL);

  if (server->clients != NULL) {
    unsigned int i;
    for (i = 0; i < server->num_clients; i++) {
      if (server->clients[i].fd != -1) {
        close(server->clients[i].fd);
      }
    }
    free(server->clients);
  }
  server->clients       = NULL;
  server->num_clients   = 0;
  server->count_clients = 0;
  server->max_clients   = 0;
  
  if (server->fd != -1)
    close(server->fd);
  server->fd = -1;

  server->callback = NULL;
}